

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

int IsValidExtendedFormat(WebPDemuxer *dmux)

{
  int *piVar1;
  WebPDemuxState WVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Frame *pFVar9;
  
  WVar2 = dmux->state;
  iVar8 = 1;
  if (WVar2 != WEBP_DEMUX_PARSING_HEADER) {
    iVar8 = dmux->canvas_width;
    if (((0 < iVar8) && (iVar3 = dmux->canvas_height, 0 < iVar3)) && (-1 < dmux->loop_count)) {
      uVar4 = dmux->feature_flags;
      pFVar9 = dmux->frames;
      if ((uVar4 & 0xffffffc1) == 0 && (pFVar9 != (Frame *)0x0 || WVar2 != WEBP_DEMUX_DONE)) {
        if (pFVar9 == (Frame *)0x0) {
          return 1;
        }
        do {
          piVar1 = &pFVar9->frame_num;
          do {
            if (pFVar9->frame_num != *piVar1) break;
            if (((uVar4 & 2) == 0) && (1 < pFVar9->frame_num)) {
              return 0;
            }
            if (pFVar9->complete == 0) {
              if (WVar2 == WEBP_DEMUX_DONE) {
                return 0;
              }
              if (((pFVar9->img_components[1].size != 0) && (pFVar9->img_components[0].size != 0))
                 && (pFVar9->img_components[0].offset < pFVar9->img_components[1].offset)) {
                return 0;
              }
              if (pFVar9->next != (Frame *)0x0) {
                return 0;
              }
            }
            else {
              if (pFVar9->img_components[1].size == 0) {
                if (pFVar9->img_components[0].size == 0) {
                  return 0;
                }
              }
              else if (pFVar9->img_components[0].offset < pFVar9->img_components[1].offset) {
                return 0;
              }
              if (pFVar9->width < 1) {
                return 0;
              }
              if (pFVar9->height < 1) {
                return 0;
              }
            }
            iVar5 = pFVar9->width;
            if ((0 < iVar5) && (iVar6 = pFVar9->height, 0 < iVar6)) {
              iVar7 = pFVar9->x_offset;
              if ((uVar4 & 2) == 0) {
                if ((((iVar7 != 0) || (iVar6 != iVar3)) || (iVar5 != iVar8)) ||
                   (pFVar9->y_offset != 0)) {
                  return 0;
                }
              }
              else {
                if (iVar7 < 0) {
                  return 0;
                }
                if (pFVar9->y_offset < 0) {
                  return 0;
                }
                if (iVar8 < iVar7 + iVar5) {
                  return 0;
                }
                if (iVar3 < pFVar9->y_offset + iVar6) {
                  return 0;
                }
              }
            }
            pFVar9 = pFVar9->next;
          } while (pFVar9 != (Frame *)0x0);
          if (pFVar9 == (Frame *)0x0) {
            return 1;
          }
        } while( true );
      }
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int IsValidExtendedFormat(const WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags & ANIMATION_FLAG);
  const Frame* f = dmux->frames;

  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width <= 0 || dmux->canvas_height <= 0) return 0;
  if (dmux->loop_count < 0) return 0;
  if (dmux->state == WEBP_DEMUX_DONE && dmux->frames == NULL) return 0;
  if (dmux->feature_flags & ~ALL_VALID_FLAGS) return 0;  // invalid bitstream

  while (f != NULL) {
    const int cur_frame_set = f->frame_num;

    // Check frame properties.
    for (; f != NULL && f->frame_num == cur_frame_set; f = f->next) {
      const ChunkData* const image = f->img_components;
      const ChunkData* const alpha = f->img_components + 1;

      if (!is_animation && f->frame_num > 1) return 0;

      if (f->complete) {
        if (alpha->size == 0 && image->size == 0) return 0;
        // Ensure alpha precedes image bitstream.
        if (alpha->size > 0 && alpha->offset > image->offset) {
          return 0;
        }

        if (f->width <= 0 || f->height <= 0) return 0;
      } else {
        // There shouldn't be a partial frame in a complete file.
        if (dmux->state == WEBP_DEMUX_DONE) return 0;

        // Ensure alpha precedes image bitstream.
        if (alpha->size > 0 && image->size > 0 &&
            alpha->offset > image->offset) {
          return 0;
        }
        // There shouldn't be any frames after an incomplete one.
        if (f->next != NULL) return 0;
      }

      if (f->width > 0 && f->height > 0 &&
          !CheckFrameBounds(f, !is_animation,
                            dmux->canvas_width, dmux->canvas_height)) {
        return 0;
      }
    }
  }
  return 1;
}